

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

bool process_import(CompilationContext *ctx)

{
  bool bVar1;
  char *importPtr;
  int importEndCol;
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  keepRanges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directives;
  ImportParser importParser;
  char *local_98;
  int local_8c;
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ImportParser local_48;
  
  local_48.p = (char *)0x0;
  local_48.curLinePtr = (char *)0x0;
  local_48.line = -1;
  local_48.errors = false;
  local_48.directives =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_48.keepRanges =
       (vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
        *)0x0;
  local_48.errorCb = error_cb;
  local_98 = (ctx->code)._M_dataplus._M_p;
  ctx->firstLineAfterImport = 1;
  local_8c = 0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.cbUserPointer = ctx;
  bVar1 = sqimportparser::ImportParser::parse
                    (&local_48,&local_98,&ctx->firstLineAfterImport,&local_8c,&ctx->imports,
                     &local_68,&local_88);
  if (bVar1) {
    sqimportparser::ImportParser::replaceImportBySpaces
              ((ctx->code)._M_dataplus._M_p,local_98,&local_88);
  }
  if (local_88.
      super__Vector_base<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar1;
}

Assistant:

bool process_import(CompilationContext & ctx)
{
  ImportParser importParser(error_cb, &ctx);
  const char * importPtr = ctx.code.c_str();
  ctx.firstLineAfterImport = 1;
  int importEndCol = 0;
  vector<string> directives;
  vector<pair<const char *, const char *>> keepRanges;
  if (!importParser.parse(&importPtr, ctx.firstLineAfterImport, importEndCol, ctx.imports, &directives, &keepRanges))
    return false;

  (void) importEndCol;
  (void) directives;

  ImportParser::replaceImportBySpaces((char *)ctx.code.c_str(), (char *)importPtr, keepRanges);

  return true;
}